

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImgWindow.cpp
# Opt level: O2

void __thiscall
ImgWindow::translateToImguiSpace(ImgWindow *this,int inX,int inY,float *outX,float *outY)

{
  int iVar1;
  int iVar2;
  float fVar3;
  
  iVar1 = this->mLeft;
  iVar2 = inX - iVar1;
  fVar3 = (float)iVar2;
  *outX = fVar3;
  if ((-1 < iVar2) && (fVar3 <= (float)(this->mRight - iVar1))) {
    iVar1 = this->mTop;
    iVar2 = iVar1 - inY;
    fVar3 = (float)iVar2;
    *outY = fVar3;
    if ((-1 < iVar2) && (fVar3 <= (float)(iVar1 - this->mBottom))) {
      return;
    }
  }
  *outX = -3.4028235e+38;
  *outY = -3.4028235e+38;
  return;
}

Assistant:

void
ImgWindow::translateToImguiSpace(int inX, int inY, float &outX, float &outY)
{
	outX = static_cast<float>(inX - mLeft);
	if (outX < 0.0f || outX > (float)(mRight - mLeft)) {
		outX = -FLT_MAX;
		outY = -FLT_MAX;
		return;
	}
	outY = static_cast<float>(mTop-inY);
	if (outY < 0.0f || outY > (float)(mTop - mBottom)) {
		outX = -FLT_MAX;
		outY = -FLT_MAX;
		return;
	}
}